

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

string * cmQtAutoGenInitializer::InfoWriter::ConfigKey
                   (string *__return_storage_ptr__,char *key,string *config)

{
  allocator<char> local_22;
  undefined1 local_21;
  string *local_20;
  string *config_local;
  char *key_local;
  string *ckey;
  
  local_21 = 0;
  local_20 = config;
  config_local = (string *)key;
  key_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,key,&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenInitializer::InfoWriter::ConfigKey(
  const char* key, std::string const& config)
{
  std::string ckey = key;
  ckey += '_';
  ckey += config;
  return ckey;
}